

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  FileDescriptor *pFVar6;
  MessageOptions *this_00;
  FileDescriptor *this_01;
  string *psVar7;
  Descriptor *in_RDX;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  FieldDescriptor *local_50;
  FieldDescriptor *field;
  int i;
  undefined1 local_38 [8];
  string superclass;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  superclass.field_2._8_8_ = printer;
  SuperClassName_abi_cxx11_((string *)local_38,(cxx *)this->descriptor_,in_RDX);
  io::Printer::Print((Printer *)superclass.field_2._8_8_,
                     "$classname$::$classname$()\n  : $superclass$() {\n  SharedCtor();\n}\n",
                     "classname",&this->classname_,"superclass",(string *)local_38);
  io::Printer::Print((Printer *)superclass.field_2._8_8_,
                     "\nvoid $classname$::InitAsDefaultInstance() {\n","classname",&this->classname_
                    );
  for (field._0_4_ = 0; iVar1 = (int)field, iVar4 = Descriptor::field_count(this->descriptor_),
      iVar1 < iVar4; field._0_4_ = (int)field + 1) {
    local_50 = Descriptor::field(this->descriptor_,(int)field);
    bVar3 = FieldDescriptor::is_repeated(local_50);
    if ((!bVar3) && (CVar5 = FieldDescriptor::cpp_type(local_50), CVar5 == CPPTYPE_MESSAGE)) {
      pFVar6 = Descriptor::file(this->descriptor_);
      uVar2 = superclass.field_2._8_8_;
      FieldName_abi_cxx11_(&local_70,(cxx *)local_50,field_00);
      FieldMessageTypeName_abi_cxx11_(&local_90,(cxx *)local_50,field_01);
      PrintHandlingOptionalStaticInitializers
                (pFVar6,(Printer *)uVar2,
                 "  $name$_ = const_cast< $type$*>(&$type$::default_instance());\n",
                 "  $name$_ = const_cast< $type$*>(\n      $type$::internal_default_instance());\n",
                 "name",&local_70,"type",&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  io::Printer::Print((Printer *)superclass.field_2._8_8_,"}\n\n");
  io::Printer::Print((Printer *)superclass.field_2._8_8_,
                     "$classname$::$classname$(const $classname$& from)\n  : $superclass$() {\n  SharedCtor();\n  MergeFrom(from);\n}\n\n"
                     ,"classname",&this->classname_,"superclass",(string *)local_38);
  GenerateSharedConstructorCode(this,(Printer *)superclass.field_2._8_8_);
  io::Printer::Print((Printer *)superclass.field_2._8_8_,
                     "$classname$::~$classname$() {\n  SharedDtor();\n}\n\n","classname",
                     &this->classname_);
  GenerateSharedDestructorCode(this,(Printer *)superclass.field_2._8_8_);
  io::Printer::Print((Printer *)superclass.field_2._8_8_,
                     "void $classname$::SetCachedSize(int size) const {\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n}\n"
                     ,"classname",&this->classname_);
  pFVar6 = Descriptor::file(this->descriptor_);
  bVar3 = HasDescriptorMethods(pFVar6);
  if (bVar3) {
    this_00 = Descriptor::options(this->descriptor_);
    bVar3 = MessageOptions::no_standard_descriptor_accessor(this_00);
    uVar2 = superclass.field_2._8_8_;
    if (!bVar3) {
      pFVar6 = Descriptor::file(this->descriptor_);
      psVar7 = FileDescriptor::name_abi_cxx11_(pFVar6);
      GlobalAddDescriptorsName(&local_b0,psVar7);
      io::Printer::Print((Printer *)uVar2,
                         "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n  protobuf_AssignDescriptorsOnce();\n  return $classname$_descriptor_;\n}\n\n"
                         ,"classname",&this->classname_,"adddescriptorsname",&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  io::Printer::Print((Printer *)superclass.field_2._8_8_,
                     "const $classname$& $classname$::default_instance() {\n","classname",
                     &this->classname_);
  pFVar6 = Descriptor::file(this->descriptor_);
  uVar2 = superclass.field_2._8_8_;
  this_01 = Descriptor::file(this->descriptor_);
  psVar7 = FileDescriptor::name_abi_cxx11_(this_01);
  GlobalAddDescriptorsName(&local_d0,psVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
  PrintHandlingOptionalStaticInitializers
            (pFVar6,(Printer *)uVar2,"  if (default_instance_ == NULL) $adddescriptorsname$();\n",
             "  $adddescriptorsname$();\n","adddescriptorsname",&local_d0,(char *)0x0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_d0);
  uVar2 = superclass.field_2._8_8_;
  pFVar6 = Descriptor::file(this->descriptor_);
  psVar7 = FileDescriptor::name_abi_cxx11_(pFVar6);
  GlobalAddDescriptorsName(&local_118,psVar7);
  io::Printer::Print((Printer *)uVar2,
                     "  return *default_instance_;\n}\n\n$classname$* $classname$::default_instance_ = NULL;\n\n$classname$* $classname$::New() const {\n  return new $classname$;\n}\n"
                     ,"classname",&this->classname_,"adddescriptorsname",&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void MessageGenerator::
GenerateStructors(io::Printer* printer) {
  string superclass = SuperClassName(descriptor_);

  // Generate the default constructor.
  printer->Print(
    "$classname$::$classname$()\n"
    "  : $superclass$() {\n"
    "  SharedCtor();\n"
    "}\n",
    "classname", classname_,
    "superclass", superclass);

  printer->Print(
    "\n"
    "void $classname$::InitAsDefaultInstance() {\n",
    "classname", classname_);

  // The default instance needs all of its embedded message pointers
  // cross-linked to other default instances.  We can't do this initialization
  // in the constructor because some other default instances may not have been
  // constructed yet at that time.
  // TODO(kenton):  Maybe all message fields (even for non-default messages)
  //   should be initialized to point at default instances rather than NULL?
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      PrintHandlingOptionalStaticInitializers(
        descriptor_->file(), printer,
        // With static initializers.
        "  $name$_ = const_cast< $type$*>(&$type$::default_instance());\n",
        // Without.
        "  $name$_ = const_cast< $type$*>(\n"
        "      $type$::internal_default_instance());\n",
        // Vars.
        "name", FieldName(field),
        "type", FieldMessageTypeName(field));
    }
  }
  printer->Print(
    "}\n"
    "\n");

  // Generate the copy constructor.
  printer->Print(
    "$classname$::$classname$(const $classname$& from)\n"
    "  : $superclass$() {\n"
    "  SharedCtor();\n"
    "  MergeFrom(from);\n"
    "}\n"
    "\n",
    "classname", classname_,
    "superclass", superclass);

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(printer);

  // Generate the destructor.
  printer->Print(
    "$classname$::~$classname$() {\n"
    "  SharedDtor();\n"
    "}\n"
    "\n",
    "classname", classname_);

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(printer);

  // Generate SetCachedSize.
  printer->Print(
    "void $classname$::SetCachedSize(int size) const {\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "  _cached_size_ = size;\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "}\n",
    "classname", classname_);

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file()) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
      "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n"
      "  protobuf_AssignDescriptorsOnce();\n"
      "  return $classname$_descriptor_;\n"
      "}\n"
      "\n",
      "classname", classname_,
      "adddescriptorsname",
      GlobalAddDescriptorsName(descriptor_->file()->name()));
  }

  printer->Print(
    "const $classname$& $classname$::default_instance() {\n",
    "classname", classname_);

  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "  if (default_instance_ == NULL) $adddescriptorsname$();\n",
    // Without.
    "  $adddescriptorsname$();\n",
    // Vars.
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));

  printer->Print(
    "  return *default_instance_;\n"
    "}\n"
    "\n"
    "$classname$* $classname$::default_instance_ = NULL;\n"
    "\n"
    "$classname$* $classname$::New() const {\n"
    "  return new $classname$;\n"
    "}\n",
    "classname", classname_,
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));
}